

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void __thiscall ncnn::Mat::substract_mean_normalize(Mat *this,float *mean_vals,float *norm_vals)

{
  float fVar1;
  float fVar2;
  Layer *pLVar3;
  float *pfVar4;
  long in_RDX;
  long in_RSI;
  size_t i;
  long in_RDI;
  Option opt;
  int q_2;
  Mat weights_2 [2];
  ParamDict pd_2;
  int q_1;
  Mat weights_1 [1];
  ParamDict pd_1;
  int q;
  Mat weights [1];
  ParamDict pd;
  Layer *op;
  Allocator *in_stack_fffffffffffffb28;
  Mat *in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb38;
  int in_stack_fffffffffffffb3c;
  Mat *in_stack_fffffffffffffb40;
  Mat *in_stack_fffffffffffffb48;
  ParamDict *in_stack_fffffffffffffb50;
  Mat *local_4a0;
  Mat *local_448;
  Mat *local_410;
  Mat *local_3c8;
  Mat *local_390;
  Mat *local_348;
  undefined1 local_330 [4];
  undefined4 local_32c;
  undefined1 local_2f0 [20];
  int local_2dc;
  Mat local_248;
  Mat local_200;
  Mat local_1b8;
  Mat local_148;
  undefined1 auStack_100 [24];
  undefined1 local_e8 [20];
  int local_d4;
  Mat local_88;
  undefined1 auStack_40 [32];
  Layer *local_20;
  long local_18;
  long local_10;
  
  local_10 = in_RSI;
  if ((in_RSI == 0) || (in_RDX != 0)) {
    local_18 = in_RDX;
    if ((in_RSI == 0) && (in_RDX != 0)) {
      local_20 = create_layer(in_stack_fffffffffffffb3c);
      ParamDict::ParamDict(in_stack_fffffffffffffb50);
      ParamDict::set((ParamDict *)(auStack_100 + 8),0,*(int *)(in_RDI + 0x38));
      (*local_20->_vptr_Layer[2])(local_20,auStack_100 + 8);
      local_3c8 = &local_148;
      do {
        Mat(local_3c8);
        local_3c8 = local_3c8 + 1;
      } while (local_3c8 != (Mat *)auStack_100);
      Mat(in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,(size_t)in_stack_fffffffffffffb30,
          in_stack_fffffffffffffb28);
      operator=((Mat *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                in_stack_fffffffffffffb30);
      ~Mat((Mat *)0x1451ba);
      for (local_1b8.allocator._4_4_ = 0; pLVar3 = local_20,
          local_1b8.allocator._4_4_ < *(int *)(in_RDI + 0x38);
          local_1b8.allocator._4_4_ = local_1b8.allocator._4_4_ + 1) {
        fVar1 = *(float *)(local_18 + (long)local_1b8.allocator._4_4_ * 4);
        pfVar4 = operator[](&local_148,(long)local_1b8.allocator._4_4_);
        *pfVar4 = fVar1;
      }
      ModelBinFromMatArray::ModelBinFromMatArray
                ((ModelBinFromMatArray *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
      (*pLVar3->_vptr_Layer[3])(pLVar3,&local_1b8.elemsize);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffffb30)
      ;
      local_410 = (Mat *)auStack_100;
      do {
        local_410 = local_410 + -1;
        ~Mat((Mat *)0x145380);
      } while (local_410 != &local_148);
      ParamDict::~ParamDict((ParamDict *)in_stack_fffffffffffffb30);
    }
    else {
      if (in_RSI == 0) {
        return;
      }
      if (in_RDX == 0) {
        return;
      }
      local_20 = create_layer(in_stack_fffffffffffffb3c);
      ParamDict::ParamDict(in_stack_fffffffffffffb50);
      ParamDict::set((ParamDict *)&local_1b8,0,*(int *)(in_RDI + 0x38));
      ParamDict::set((ParamDict *)&local_1b8,1,1);
      (*local_20->_vptr_Layer[2])(local_20,&local_1b8);
      local_448 = &local_248;
      do {
        Mat(local_448);
        local_448 = local_448 + 1;
      } while (local_448 != &local_1b8);
      Mat(in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,(size_t)in_stack_fffffffffffffb30,
          in_stack_fffffffffffffb28);
      operator=((Mat *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                in_stack_fffffffffffffb30);
      ~Mat((Mat *)0x14556b);
      Mat(in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,(size_t)in_stack_fffffffffffffb30,
          in_stack_fffffffffffffb28);
      operator=((Mat *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                in_stack_fffffffffffffb30);
      ~Mat((Mat *)0x1455b2);
      for (local_2dc = 0; pLVar3 = local_20, local_2dc < *(int *)(in_RDI + 0x38);
          local_2dc = local_2dc + 1) {
        fVar1 = *(float *)(local_18 + (long)local_2dc * 4);
        pfVar4 = operator[](&local_248,(long)local_2dc);
        *pfVar4 = fVar1;
        i = (size_t)local_2dc;
        fVar1 = *(float *)(local_10 + i * 4);
        fVar2 = *(float *)(local_18 + i * 4);
        pfVar4 = operator[](&local_200,i);
        *pfVar4 = -fVar1 * fVar2;
      }
      ModelBinFromMatArray::ModelBinFromMatArray
                ((ModelBinFromMatArray *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
      (*pLVar3->_vptr_Layer[3])(pLVar3,local_2f0);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffffb30)
      ;
      local_4a0 = &local_1b8;
      do {
        local_4a0 = local_4a0 + -1;
        ~Mat((Mat *)0x1457cd);
      } while (local_4a0 != &local_248);
      ParamDict::~ParamDict((ParamDict *)in_stack_fffffffffffffb30);
    }
  }
  else {
    local_20 = create_layer(in_stack_fffffffffffffb3c);
    ParamDict::ParamDict(in_stack_fffffffffffffb50);
    ParamDict::set((ParamDict *)(auStack_40 + 0x10),0,*(int *)(in_RDI + 0x38));
    (*local_20->_vptr_Layer[2])(local_20,auStack_40 + 0x10);
    local_348 = &local_88;
    do {
      Mat(local_348);
      local_348 = local_348 + 1;
    } while (local_348 != (Mat *)auStack_40);
    Mat(in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,(size_t)in_stack_fffffffffffffb30,
        in_stack_fffffffffffffb28);
    operator=((Mat *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
              in_stack_fffffffffffffb30);
    ~Mat((Mat *)0x144e11);
    for (local_d4 = 0; pLVar3 = local_20, local_d4 < *(int *)(in_RDI + 0x38);
        local_d4 = local_d4 + 1) {
      fVar1 = *(float *)(local_10 + (long)local_d4 * 4);
      pfVar4 = operator[](&local_88,(long)local_d4);
      *pfVar4 = -fVar1;
    }
    ModelBinFromMatArray::ModelBinFromMatArray
              ((ModelBinFromMatArray *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
    (*pLVar3->_vptr_Layer[3])(pLVar3,local_e8);
    ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffffb30);
    local_390 = (Mat *)auStack_40;
    do {
      local_390 = local_390 + -1;
      ~Mat((Mat *)0x144fe2);
    } while (local_390 != &local_88);
    ParamDict::~ParamDict((ParamDict *)in_stack_fffffffffffffb30);
  }
  Option::Option((Option *)in_stack_fffffffffffffb30);
  local_32c = 1;
  (*local_20->_vptr_Layer[4])(local_20,local_330);
  (*local_20->_vptr_Layer[9])(local_20,in_RDI,local_330);
  (*local_20->_vptr_Layer[5])(local_20,local_330);
  if (local_20 != (Layer *)0x0) {
    (*local_20->_vptr_Layer[1])();
  }
  return;
}

Assistant:

void Mat::substract_mean_normalize(const float* mean_vals, const float* norm_vals)
{
    Layer* op;

    if (mean_vals && !norm_vals)
    {
        // substract mean only
        op = create_layer(LayerType::Bias);

        ParamDict pd;
        pd.set(0, c);

        op->load_param(pd);

        Mat weights[1];
        weights[0] = Mat(c);
        for (int q = 0; q < c; q++)
        {
            weights[0][q] = -mean_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else if (!mean_vals && norm_vals)
    {
        // normalize only
        op = create_layer(LayerType::Scale);

        ParamDict pd;
        pd.set(0, c);

        op->load_param(pd);

        Mat weights[1];
        weights[0] = Mat(c);
        for (int q = 0; q < c; q++)
        {
            weights[0][q] = norm_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else if (mean_vals && norm_vals)
    {
        // substract mean and normalize
        op = create_layer(LayerType::Scale);

        ParamDict pd;
        pd.set(0, c);
        pd.set(1, 1);

        op->load_param(pd);

        Mat weights[2];
        weights[0] = Mat(c);
        weights[1] = Mat(c);
        for (int q = 0; q < c; q++)
        {
            weights[0][q] = norm_vals[q];
            weights[1][q] = -mean_vals[q] * norm_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else // if (!mean_vals && !norm_vals)
    {
        return;
    }

    Option opt;
    opt.num_threads = 1; // TODO

    op->create_pipeline(opt);

    op->forward_inplace(*this, opt);

    op->destroy_pipeline(opt);

    delete op;
}